

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

container_t * container_from_range(uint8_t *type,uint32_t min,uint32_t max,uint16_t step)

{
  uint size_00;
  bitset_container_t *bitset;
  array_container_t *array;
  int size;
  uint16_t step_local;
  uint32_t max_local;
  uint32_t min_local;
  uint8_t *type_local;
  
  if (step == 0) {
    type_local = (uint8_t *)0x0;
  }
  else if (step == 1) {
    type_local = (uint8_t *)container_range_of_ones(min,max,type);
  }
  else {
    size_00 = (((max - min) + (uint)step) - 1) / (uint)step;
    if ((int)size_00 < 0x1001) {
      *type = '\x02';
      type_local = (uint8_t *)array_container_create_given_capacity(size_00);
      array_container_add_from_range((array_container_t *)type_local,min,max,step);
      if (((array_container_t *)type_local)->cardinality != size_00) {
        __assert_fail("array->cardinality == size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x114f,
                      "container_t *container_from_range(uint8_t *, uint32_t, uint32_t, uint16_t)");
      }
    }
    else {
      *type = '\x01';
      type_local = (uint8_t *)bitset_container_create();
      bitset_container_add_from_range((bitset_container_t *)type_local,min,max,step);
      if (((bitset_container_t *)type_local)->cardinality != size_00) {
        __assert_fail("bitset->cardinality == size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x1155,
                      "container_t *container_from_range(uint8_t *, uint32_t, uint32_t, uint16_t)");
      }
    }
  }
  return type_local;
}

Assistant:

static inline container_t *container_from_range(
    uint8_t *type, uint32_t min,
    uint32_t max, uint16_t step
){
    if (step == 0) return NULL;  // being paranoid
    if (step == 1) {
        return container_range_of_ones(min,max,type);
        // Note: the result is not always a run (need to check the cardinality)
        //*type = RUN_CONTAINER_TYPE;
        //return run_container_create_range(min, max);
    }
    int size = (max - min + step - 1) / step;
    if (size <= DEFAULT_MAX_SIZE) {  // array container
        *type = ARRAY_CONTAINER_TYPE;
        array_container_t *array = array_container_create_given_capacity(size);
        array_container_add_from_range(array, min, max, step);
        assert(array->cardinality == size);
        return array;
    } else {  // bitset container
        *type = BITSET_CONTAINER_TYPE;
        bitset_container_t *bitset = bitset_container_create();
        bitset_container_add_from_range(bitset, min, max, step);
        assert(bitset->cardinality == size);
        return bitset;
    }
}